

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PatternModel.cpp
# Opt level: O1

PatternClip * __thiscall PatternModel::clip(PatternClip *__return_storage_ptr__,PatternModel *this)

{
  ulong uVar1;
  ulong uVar2;
  PatternSelection *this_00;
  PatternAnchor anchor;
  PatternSelection local_48;
  PatternSelection local_30;
  
  PatternClip::PatternClip(__return_storage_ptr__);
  if (this->mHasSelection == true) {
    this_00 = &local_48;
    local_48.mEnd.super_PatternCursorBase.column =
         (this->mSelection).mEnd.super_PatternCursorBase.column;
    local_48.mEnd.super_PatternCursorBase.track =
         (this->mSelection).mEnd.super_PatternCursorBase.track;
    local_48.mStart.super_PatternCursorBase.row =
         (this->mSelection).mStart.super_PatternCursorBase.row;
    local_48.mStart.super_PatternCursorBase.column =
         (this->mSelection).mStart.super_PatternCursorBase.column;
    local_48._8_8_ = *(undefined8 *)&(this->mSelection).mStart.super_PatternCursorBase.track;
  }
  else {
    uVar1._0_4_ = (this->mCursor).super_PatternCursorBase.row;
    uVar1._4_4_ = (this->mCursor).super_PatternCursorBase.column;
    if ((uint)uVar1._4_4_ < 9) {
      uVar2 = *(ulong *)(&DAT_001b6f70 + (uVar1 >> 0x20) * 8);
    }
    else {
      uVar2 = 0x400000000;
    }
    anchor.super_PatternCursorBase._0_8_ = uVar1 & 0xffffffff | uVar2;
    this_00 = &local_30;
    anchor.super_PatternCursorBase.track = (this->mCursor).super_PatternCursorBase.track;
    PatternSelection::PatternSelection(this_00,anchor);
  }
  PatternClip::save(__return_storage_ptr__,&this->mPatternCurr,*this_00);
  return __return_storage_ptr__;
}

Assistant:

PatternClip PatternModel::clip() {
    PatternClip clip;
    
    if (mHasSelection) {
        clip.save(mPatternCurr, mSelection);
    } else {
        clip.save(mPatternCurr, PatternSelection(mCursor));
    }

    return clip;
}